

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBColumnsInit(ClientContext *context,TableFunctionInitInput *input)

{
  long *plVar1;
  pointer *__ptr;
  pointer prVar2;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  long *local_78;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_70;
  undefined1 *local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_48;
  
  plVar1 = (long *)operator_new(0x30);
  *plVar1 = (long)&PTR__DuckDBColumnsData_01988528;
  plVar1[1] = 0;
  plVar1[2] = 0;
  plVar1[3] = 0;
  plVar1[4] = 0;
  plVar1[5] = 0;
  local_78 = plVar1;
  Catalog::GetAllSchemas(&local_48,(ClientContext *)input);
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar2 = local_48.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70._M_head_impl = (GlobalTableFunctionState *)context;
    do {
      local_60 = 0;
      local_50 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_columns.cpp:90:21)>
                 ::_M_invoke;
      local_58 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_columns.cpp:90:21)>
                 ::_M_manager;
      local_68 = (undefined1 *)&local_78;
      (*(prVar2->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (prVar2->_M_data,input,1,&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      prVar2 = prVar2 + 1;
      context = (ClientContext *)local_70._M_head_impl;
      plVar1 = local_78;
    } while (prVar2 != local_48.
                       super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_78 = (long *)0x0;
  *(long **)context = plVar1;
  if ((local_48.
       super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
     (operator_delete(local_48.
                      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start), local_78 != (long *)0x0)) {
    (**(code **)(*local_78 + 8))();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBColumnsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBColumnsData>();

	// scan all the schemas for tables and views and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		schema.get().Scan(context, CatalogType::TABLE_ENTRY,
		                  [&](CatalogEntry &entry) { result->entries.push_back(entry); });
	}
	return std::move(result);
}